

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::GetFilenamePath(string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  allocator local_51;
  string ret;
  string fn;
  
  std::__cxx11::string::string((string *)&fn,(string *)filename);
  ConvertToUnixSlashes(&fn);
  lVar1 = std::__cxx11::string::rfind((char *)&fn,0x4edda2);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&ret);
  }
  else {
    std::__cxx11::string::substr((ulong)&ret,(ulong)&fn);
    if (ret._M_string_length == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"/",&local_51);
    }
    else if ((ret._M_string_length == 2) && (ret._M_dataplus._M_p[1] == ':')) {
      std::operator+(__return_storage_ptr__,&ret,'/');
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p == &ret.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ret.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = ret._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(ret.field_2._M_allocated_capacity._1_7_,ret.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = ret._M_string_length;
      ret._M_string_length = 0;
      ret.field_2._M_local_buf[0] = '\0';
      ret._M_dataplus._M_p = (pointer)&ret.field_2;
    }
    std::__cxx11::string::~string((string *)&ret);
  }
  std::__cxx11::string::~string((string *)&fn);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::GetFilenamePath(const kwsys_stl::string& filename)
{
  kwsys_stl::string fn = filename;
  SystemTools::ConvertToUnixSlashes(fn);

  kwsys_stl::string::size_type slash_pos = fn.rfind("/");
  if(slash_pos != kwsys_stl::string::npos)
    {
    kwsys_stl::string  ret = fn.substr(0, slash_pos);
    if(ret.size() == 2 && ret[1] == ':')
      {
      return ret + '/';
      }
    if(ret.empty())
      {
      return "/";
      }
    return ret;
    }
  else
    {
    return "";
    }
}